

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  ulong uVar3;
  uint64_t id;
  ulong uVar4;
  Maybe<capnp::InterfaceSchema> MVar5;
  Schema local_c8;
  Schema local_c0;
  Reader superclasses;
  Fault f;
  RawBrandedSchema *local_78;
  uint64_t *local_70;
  WirePointer *local_68;
  uint local_60;
  ushort local_5c;
  int local_58;
  PointerReader local_50;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar2;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  superclasses.reader.segment = (SegmentReader *)CONCAT44(superclasses.reader.segment._4_4_,uVar1);
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = uVar1 < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    if (*(uint **)**(long **)typeId == counter) {
      *(undefined1 *)&(this->super_Schema).raw = 1;
      local_50.capTable = *(CapTableReader **)typeId;
      aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
LAB_001ab27a:
      this[1].super_Schema.raw = (RawBrandedSchema *)local_50.capTable;
    }
    else {
      superclasses.reader.ptr = *(byte **)(**(long **)typeId + 8);
      superclasses.reader.segment = (SegmentReader *)0x0;
      superclasses.reader.capTable = (CapTableReader *)0x0;
      superclasses.reader.elementCount = 0x7fffffff;
      superclasses.reader.step = 0;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&f,(PointerReader *)&superclasses,(word *)0x0);
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)(Exception *)0x0;
      local_50.capTable = (CapTableReader *)(RawBrandedSchema *)0x0;
      local_50.nestingLimit = 0x7fffffff;
      if (4 < local_5c) {
        local_50.pointer = local_68 + 4;
        local_50.segment = (SegmentReader *)f;
        local_50.capTable = (CapTableReader *)local_78;
        local_50.nestingLimit = local_58;
      }
      capnp::_::PointerReader::getList(&superclasses.reader,&local_50,INLINE_COMPOSITE,(word *)0x0);
      uVar3 = superclasses.reader._24_8_ & 0xffffffff;
      aVar2 = extraout_RDX_00;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          capnp::_::ListReader::getStructElement
                    ((StructReader *)&f,&superclasses.reader,(ElementCount)uVar4);
          if (local_60 < 0x40) {
            id = 0;
          }
          else {
            id = *local_70;
          }
          local_c8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar4 | 0x4000000);
          local_c0.raw = (RawBrandedSchema *)Schema::asInterface(&local_c8);
          MVar5 = findSuperclass((InterfaceSchema *)&local_50,(uint64_t)&local_c0,counter);
          aVar2 = MVar5.ptr.field_1;
          if ((char)local_50.segment == '\x01') {
            *(undefined1 *)&(this->super_Schema).raw = 1;
            goto LAB_001ab27a;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x2a0,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    *(undefined1 *)&(this->super_Schema).raw = 0;
    kj::_::Debug::Fault::~Fault(&f);
    aVar2 = extraout_RDX;
  }
  MVar5.ptr.field_1 = aVar2;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar5.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_SOME(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return result;
    }
  }

  return kj::none;
}